

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-while-connecting.c
# Opt level: O2

int run_test_tcp_close_while_connecting(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_connect_t connect_req;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("1.2.3.4",0x23a3,&addr);
  connect_req.data = (void *)(long)iVar1;
  if (connect_req.data == (void *)0x0) {
    iVar1 = uv_tcp_init(uVar2,&tcp_handle);
    connect_req.data = (void *)(long)iVar1;
    if (connect_req.data == (void *)0x0) {
      iVar1 = uv_tcp_connect(&connect_req,&tcp_handle,&addr,connect_cb);
      if (iVar1 == -0x65) {
LAB_00186dac:
        fprintf(_stderr,"%s\n","Network unreachable.");
        fflush(_stderr);
        return 7;
      }
      eval_b = (int64_t)iVar1;
      eval_b_2 = 0;
      if ((void *)eval_b == (void *)0x0) {
        iVar1 = uv_timer_init(uVar2,&timer1_handle);
        eval_b = (int64_t)iVar1;
        eval_b_2 = 0;
        if ((void *)eval_b == (void *)0x0) {
          iVar1 = uv_timer_start(&timer1_handle,timer1_cb,1,0);
          eval_b = (int64_t)iVar1;
          eval_b_2 = 0;
          if ((void *)eval_b == (void *)0x0) {
            iVar1 = uv_timer_init(uVar2,&timer2_handle);
            eval_b = (int64_t)iVar1;
            eval_b_2 = 0;
            if ((void *)eval_b == (void *)0x0) {
              iVar1 = uv_timer_start(&timer2_handle,timer2_cb,86400000,0);
              eval_b = (int64_t)iVar1;
              eval_b_2 = 0;
              if ((void *)eval_b == (void *)0x0) {
                iVar1 = uv_run(uVar2,0);
                eval_b = (int64_t)iVar1;
                eval_b_2 = 0;
                if ((void *)eval_b == (void *)0x0) {
                  eval_b = 1;
                  eval_b_2 = (int64_t)connect_cb_called;
                  if (eval_b_2 == 1) {
                    eval_b = 1;
                    eval_b_2 = (int64_t)timer1_cb_called;
                    if (eval_b_2 == 1) {
                      eval_b = 2;
                      eval_b_2 = (int64_t)close_cb_called;
                      if (eval_b_2 == 2) {
                        uv_walk(uVar2,close_walk_cb,0);
                        uv_run(uVar2,0);
                        eval_b = 0;
                        iVar1 = uv_loop_close(uVar2);
                        eval_b_2 = (int64_t)iVar1;
                        if (eval_b_2 == 0) {
                          uv_library_shutdown();
                          if (netunreach_errors < 1) {
                            return 0;
                          }
                          goto LAB_00186dac;
                        }
                        pcVar4 = "uv_loop_close(loop)";
                        pcVar3 = "0";
                        uVar2 = 0x5b;
                      }
                      else {
                        pcVar4 = "close_cb_called";
                        pcVar3 = "2";
                        uVar2 = 0x59;
                      }
                    }
                    else {
                      pcVar4 = "timer1_cb_called";
                      pcVar3 = "1";
                      uVar2 = 0x58;
                    }
                  }
                  else {
                    pcVar4 = "connect_cb_called";
                    pcVar3 = "1";
                    uVar2 = 0x57;
                  }
                }
                else {
                  pcVar4 = "0";
                  pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
                  uVar2 = 0x55;
                }
              }
              else {
                pcVar4 = "0";
                pcVar3 = "uv_timer_start(&timer2_handle, timer2_cb, 86400 * 1000, 0)";
                uVar2 = 0x54;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "uv_timer_init(loop, &timer2_handle)";
              uVar2 = 0x53;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "uv_timer_start(&timer1_handle, timer1_cb, 1, 0)";
            uVar2 = 0x52;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_timer_init(loop, &timer1_handle)";
          uVar2 = 0x51;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0x50;
      }
      goto LAB_00187054;
    }
    pcVar3 = "uv_tcp_init(loop, &tcp_handle)";
    uVar2 = 0x49;
  }
  else {
    pcVar3 = "uv_ip4_addr(\"1.2.3.4\", 9123, &addr)";
    uVar2 = 0x48;
  }
  pcVar4 = "0";
  eval_b_2 = 0;
  eval_b = (int64_t)connect_req.data;
LAB_00187054:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-while-connecting.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(tcp_close_while_connecting) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT_OK(uv_ip4_addr("1.2.3.4", TEST_PORT, &addr));
  ASSERT_OK(uv_tcp_init(loop, &tcp_handle));
  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT_OK(r);
  ASSERT_OK(uv_timer_init(loop, &timer1_handle));
  ASSERT_OK(uv_timer_start(&timer1_handle, timer1_cb, 1, 0));
  ASSERT_OK(uv_timer_init(loop, &timer2_handle));
  ASSERT_OK(uv_timer_start(&timer2_handle, timer2_cb, 86400 * 1000, 0));
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, timer1_cb_called);
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);

  if (netunreach_errors > 0)
    RETURN_SKIP("Network unreachable.");

  return 0;
}